

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.c
# Opt level: O0

int32 mmi_viterbi_run(float64 *log_forw_prob,vector_t **feature,uint32 n_obs,state_t *state_seq,
                     uint32 n_state,model_inventory_t *inv,float64 a_beam)

{
  bool bVar1;
  float64 *scale_00;
  float64 **dscale_00;
  uint32 *n_active_astate_00;
  float64 **active_alpha_00;
  uint32 **active_astate_00;
  void *ptr;
  uint32 **bp_00;
  char *pcVar2;
  double dVar3;
  double local_b0;
  float64 log_fp;
  int local_a0;
  int final_state_error;
  int ret;
  int32 t;
  uint32 j;
  uint32 i;
  uint32 *active_cb;
  uint32 *n_active_astate;
  uint32 **bp;
  uint32 **active_astate;
  float64 **active_alpha;
  float64 **dscale;
  float64 *scale;
  float64 a_beam_local;
  model_inventory_t *inv_local;
  uint32 n_state_local;
  state_t *state_seq_local;
  uint32 n_obs_local;
  vector_t **feature_local;
  float64 *log_forw_prob_local;
  
  bVar1 = false;
  if (n_obs == 0) {
    __assert_fail("n_obs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                  ,0x2d1,
                  "int32 mmi_viterbi_run(float64 *, vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64)"
                 );
  }
  if (n_state != 0) {
    scale_00 = (float64 *)
               __ckd_calloc__((ulong)n_obs,8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                              ,0x2d4);
    dscale_00 = (float64 **)
                __ckd_calloc__((ulong)n_obs,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                               ,0x2d5);
    n_active_astate_00 =
         (uint32 *)
         __ckd_calloc__((ulong)n_obs,4,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                        ,0x2d6);
    active_alpha_00 =
         (float64 **)
         __ckd_calloc__((ulong)n_obs,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                        ,0x2d7);
    active_astate_00 =
         (uint32 **)
         __ckd_calloc__((ulong)n_obs,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                        ,0x2d8);
    ptr = __ckd_calloc__((ulong)(n_state << 1),4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                         ,0x2d9);
    bp_00 = (uint32 **)
            __ckd_calloc__((ulong)n_obs,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                           ,0x2da);
    local_a0 = forward(active_alpha_00,active_astate_00,n_active_astate_00,bp_00,scale_00,dscale_00,
                       feature,n_obs,state_seq,n_state,inv,a_beam,(s3phseg_t *)0x0,
                       (bw_timers_t *)0x0,1);
    if (local_a0 == 0) {
      for (t = 0; ((uint)t < n_active_astate_00[n_obs - 1] &&
                  (active_astate_00[n_obs - 1][(uint)t] != n_state - 1)); t = t + 1) {
      }
      if (t == n_active_astate_00[n_obs - 1]) {
        local_a0 = -1;
        bVar1 = true;
      }
      else {
        if ((double)active_alpha_00[n_obs - 1][(uint)t] <= 0.0) {
          __assert_fail("active_alpha[n_obs-1][i] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                        ,0x2f9,
                        "int32 mmi_viterbi_run(float64 *, vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64)"
                       );
        }
        local_b0 = log((double)active_alpha_00[n_obs - 1][(uint)t]);
        for (final_state_error = 0; (uint)final_state_error < n_obs;
            final_state_error = final_state_error + 1) {
          if ((double)scale_00[final_state_error] <= 0.0) {
            __assert_fail("scale[t] > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                          ,0x2fc,
                          "int32 mmi_viterbi_run(float64 *, vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64)"
                         );
          }
          dVar3 = log((double)scale_00[final_state_error]);
          local_b0 = local_b0 - dVar3;
          for (ret = 0; (uint)ret < inv->gauden->n_feat; ret = ret + 1) {
            local_b0 = (double)dscale_00[final_state_error][(uint)ret] + local_b0;
          }
        }
        *log_forw_prob = (float64)local_b0;
      }
    }
    ckd_free(scale_00);
    for (t = 0; (uint)t < n_obs; t = t + 1) {
      if (dscale_00[(uint)t] != (float64 *)0x0) {
        ckd_free(dscale_00[(uint)t]);
      }
    }
    ckd_free(dscale_00);
    ckd_free(n_active_astate_00);
    for (t = 0; (uint)t < n_obs; t = t + 1) {
      ckd_free(active_alpha_00[(uint)t]);
      ckd_free(active_astate_00[(uint)t]);
      ckd_free(bp_00[(uint)t]);
    }
    ckd_free(active_alpha_00);
    ckd_free(active_astate_00);
    ckd_free(ptr);
    ckd_free(bp_00);
    if ((local_a0 != 0) && (!bVar1)) {
      pcVar2 = corpus_utt_brief_name();
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
              ,0x318,"viterbi run error in sentence %s\n",pcVar2);
    }
    return local_a0;
  }
  __assert_fail("n_state > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                ,0x2d2,
                "int32 mmi_viterbi_run(float64 *, vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64)"
               );
}

Assistant:

int32
mmi_viterbi_run(float64 *log_forw_prob,
		vector_t **feature,
		uint32 n_obs,
		state_t *state_seq,
		uint32 n_state,
		model_inventory_t *inv,
		float64 a_beam)
{
    float64 *scale = NULL;
    float64 **dscale = NULL;
    float64 **active_alpha;
    uint32 **active_astate;
    uint32 **bp;
    uint32 *n_active_astate;
    uint32 *active_cb;
    uint32 i, j;
    int32 t;
    int ret;
    int final_state_error = 0;
    float64 log_fp;/* accumulator for the log of the probability
		    * of observing the input given the model */
    
    /* caller must ensure that there is some non-zero amount
       of work to be done here */
    assert(n_obs > 0);
    assert(n_state > 0);
    
    scale = (float64 *)ckd_calloc(n_obs, sizeof(float64));
    dscale = (float64 **)ckd_calloc(n_obs, sizeof(float64 *));
    n_active_astate = (uint32 *)ckd_calloc(n_obs, sizeof(uint32));
    active_alpha  = (float64 **)ckd_calloc(n_obs, sizeof(float64 *));
    active_astate = (uint32 **)ckd_calloc(n_obs, sizeof(uint32 *));
    active_cb = ckd_calloc(2*n_state, sizeof(uint32));
    bp = (uint32 **)ckd_calloc(n_obs, sizeof(uint32 *));

    /* Run forward algorithm, which has embedded Viterbi. */
    ret = forward(active_alpha, active_astate, n_active_astate, bp,
		  scale, dscale,
		  feature, n_obs, state_seq, n_state,
		  inv, a_beam, NULL, NULL, 1);

    if (ret != S3_SUCCESS) {

	/* Some problem with the utterance, release per utterance storage and
	 * forget about adding the utterance accumulators to the global accumulators */
	
	goto all_done;
    }

    /* Find the non-emitting ending state */
    for (i = 0; i < n_active_astate[n_obs-1]; ++i) {
	if (active_astate[n_obs-1][i] == n_state-1)
	    break;
    }
    if (i == n_active_astate[n_obs-1]) {
	/* since there are so many such errors during the mmie training,
	      it's very annoying to output this error message
	      E_ERROR("Failed to align audio to trancript: final state of the search is not reached\n"); */
	ret = S3_ERROR;
	final_state_error = 1;
	goto all_done;
    }

    /* Calculate log[ p( O | \lambda ) ] */
    assert(active_alpha[n_obs-1][i] > 0);
    log_fp = log(active_alpha[n_obs-1][i]);
    for (t = 0; t < n_obs; t++) {
        assert(scale[t] > 0);
        log_fp -= log(scale[t]);
        for (j = 0; j < inv->gauden->n_feat; j++) {
            log_fp += dscale[t][j];
        }
    }
    *log_forw_prob = log_fp;

 all_done:
    ckd_free((void *)scale);
    for (i = 0; i < n_obs; i++) {
	if (dscale[i])
	    ckd_free((void *)dscale[i]);
    }
    ckd_free((void **)dscale);
    
    ckd_free(n_active_astate);
    for (i = 0; i < n_obs; i++) {
	ckd_free((void *)active_alpha[i]);
	ckd_free((void *)active_astate[i]);
	ckd_free((void *)bp[i]);
    }
    ckd_free((void *)active_alpha);
    ckd_free((void *)active_astate);
    ckd_free((void *)active_cb);
    ckd_free((void **)bp);

    if (ret != S3_SUCCESS && !final_state_error)
	E_ERROR("viterbi run error in sentence %s\n", corpus_utt_brief_name());
    
    return ret;
}